

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O0

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_duplBits_naive_manual_::run
          (Test_bitileave_duplBits_naive_manual_ *this)

{
  SourceLocation loc;
  SourceLocation loc_00;
  SourceLocation loc_01;
  SourceLocation loc_02;
  SourceLocation loc_03;
  SourceLocation loc_04;
  SourceLocation loc_05;
  SourceLocation loc_06;
  SourceLocation loc_07;
  SourceLocation loc_08;
  SourceLocation loc_09;
  bool bVar1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_c10;
  undefined1 local_beb;
  undefined1 local_bea;
  undefined1 local_be9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_be8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  string_view local_b48;
  undefined4 local_b34;
  unsigned_long uStack_b30;
  Cmp cmp__10;
  unsigned_long *local_b28;
  unsigned_long *tr__10;
  unsigned_long **local_b18;
  uint64_t *tl__10;
  char *pcStack_b08;
  undefined8 local_b00;
  undefined1 local_af3;
  undefined1 local_af2;
  undefined1 local_af1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_af0;
  undefined1 local_acb;
  undefined1 local_aca;
  undefined1 local_ac9;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  string_view local_a28;
  undefined4 local_a18;
  uint local_a14;
  Cmp cmp__9;
  uint *tr__9;
  uint **local_a00;
  uint64_t *tl__9;
  char *pcStack_9f0;
  undefined8 local_9e8;
  undefined1 local_9db;
  undefined1 local_9da;
  undefined1 local_9d9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_9d8;
  undefined1 local_9b3;
  undefined1 local_9b2;
  undefined1 local_9b1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  string_view local_910;
  undefined4 local_900;
  uint local_8fc;
  Cmp cmp__8;
  uint *tr__8;
  uint **local_8e8;
  uint64_t *tl__8;
  char *pcStack_8d8;
  undefined8 local_8d0;
  undefined1 local_8c3;
  undefined1 local_8c2;
  undefined1 local_8c1;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_8c0;
  undefined1 local_89b;
  undefined1 local_89a;
  undefined1 local_899;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  string_view local_7f8;
  undefined4 local_7e8;
  uint local_7e4;
  Cmp cmp__7;
  uint *tr__7;
  uint **local_7d0;
  uint64_t *tl__7;
  char *pcStack_7c0;
  undefined8 local_7b8;
  undefined1 local_7ab;
  undefined1 local_7aa;
  undefined1 local_7a9;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_7a8;
  undefined1 local_783;
  undefined1 local_782;
  undefined1 local_781;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  string_view local_6e0;
  undefined4 local_6d0;
  uint local_6cc;
  Cmp cmp__6;
  uint *tr__6;
  uint **local_6b8;
  uint64_t *tl__6;
  char *pcStack_6a8;
  undefined8 local_6a0;
  undefined1 local_693;
  undefined1 local_692;
  undefined1 local_691;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_690;
  undefined1 local_66b;
  undefined1 local_66a;
  undefined1 local_669;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  string_view local_5c8;
  undefined4 local_5b8;
  uint local_5b4;
  Cmp cmp__5;
  uint *tr__5;
  uint **local_5a0;
  uint64_t *tl__5;
  char *pcStack_590;
  undefined8 local_588;
  undefined1 local_57b;
  undefined1 local_57a;
  undefined1 local_579;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_578;
  undefined1 local_553;
  undefined1 local_552;
  undefined1 local_551;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  string_view local_4b0;
  undefined4 local_4a0;
  uint local_49c;
  Cmp cmp__4;
  uint *tr__4;
  uint **local_488;
  uint64_t *tl__4;
  char *pcStack_478;
  undefined8 local_470;
  undefined1 local_463;
  undefined1 local_462;
  undefined1 local_461;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_460;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string_view local_398;
  undefined4 local_388;
  uint local_384;
  Cmp cmp__3;
  uint *tr__3;
  uint **local_370;
  uint64_t *tl__3;
  char *pcStack_360;
  undefined8 local_358;
  undefined1 local_34b;
  undefined1 local_34a;
  undefined1 local_349;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_348;
  undefined1 local_323;
  undefined1 local_322;
  undefined1 local_321;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string_view local_280;
  undefined4 local_270;
  uint local_26c;
  Cmp cmp__2;
  uint *tr__2;
  uint **local_258;
  uint64_t *tl__2;
  char *pcStack_248;
  undefined8 local_240;
  undefined1 local_233;
  undefined1 local_232;
  undefined1 local_231;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_230;
  undefined1 local_20b;
  undefined1 local_20a;
  undefined1 local_209;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string_view local_168;
  undefined4 local_158;
  uint local_154;
  Cmp cmp__1;
  uint *tr__1;
  uint **local_140;
  uint64_t *tl__1;
  char *pcStack_130;
  undefined8 local_128;
  undefined1 local_11b;
  undefined1 local_11a;
  undefined1 local_119;
  enable_if_t<isStringifieable<unsigned_int>,_std::string> local_118;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_e1;
  enable_if_t<isStringifieable<unsigned_long>,_std::string> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string_view local_40;
  undefined4 local_30;
  uint local_2c;
  Cmp cmp_;
  uint *tr_;
  uint **local_18;
  uint64_t *tl_;
  Test_bitileave_duplBits_naive_manual_ *this_local;
  
  tl_ = (uint64_t *)this;
  tr_ = (uint *)detail::duplBits_naive(0xf,0);
  local_18 = &tr_;
  local_2c = 0;
  _cmp_ = &local_2c;
  local_30 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_18,_cmp_);
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_e0,(unsigned_long *)local_18);
    local_e1 = 1;
    std::operator+(&local_c0,
                   "Comparison failed: detail::duplBits_naive(0xf, 0) == 0u (with \"detail::duplBits_naive(0xf, 0)\"="
                   ,&local_e0);
    local_f5 = 1;
    std::operator+(&local_a0,&local_c0,", \"0u\"=");
    local_f6 = 1;
    stringify<unsigned_int>(&local_118,_cmp_);
    local_119 = 1;
    std::operator+(&local_80,&local_a0,&local_118);
    local_11a = 1;
    std::operator+(&local_60,&local_80,")");
    local_11b = 1;
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    tl__1 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_130 = "run";
    local_128 = 0x19;
    loc.function = "run";
    loc.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc.line = 0x19;
    assertFail(local_40,loc);
  }
  local_e1 = 0;
  local_f5 = 0;
  local_f6 = 0;
  local_119 = 0;
  local_11a = 0;
  local_11b = 0;
  tr__1 = (uint *)detail::duplBits_naive(0xf,2);
  local_140 = &tr__1;
  local_154 = 0xff;
  _cmp__1 = &local_154;
  local_158 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_140,_cmp__1);
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_208,(unsigned_long *)local_140);
    local_209 = 1;
    std::operator+(&local_1e8,
                   "Comparison failed: detail::duplBits_naive(0xf, 2) == 0xffu (with \"detail::duplBits_naive(0xf, 2)\"="
                   ,&local_208);
    local_20a = 1;
    std::operator+(&local_1c8,&local_1e8,", \"0xffu\"=");
    local_20b = 1;
    stringify<unsigned_int>(&local_230,_cmp__1);
    local_231 = 1;
    std::operator+(&local_1a8,&local_1c8,&local_230);
    local_232 = 1;
    std::operator+(&local_188,&local_1a8,")");
    local_233 = 1;
    local_168 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_188);
    tl__2 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_248 = "run";
    local_240 = 0x1a;
    loc_00.function = "run";
    loc_00.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_00.line = 0x1a;
    assertFail(local_168,loc_00);
  }
  local_209 = 0;
  local_20a = 0;
  local_20b = 0;
  local_231 = 0;
  local_232 = 0;
  local_233 = 0;
  tr__2 = (uint *)detail::duplBits_naive(0x55,2);
  local_258 = &tr__2;
  local_26c = 0x3333;
  _cmp__2 = &local_26c;
  local_270 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_258,_cmp__2);
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_320,(unsigned_long *)local_258);
    local_321 = 1;
    std::operator+(&local_300,
                   "Comparison failed: detail::duplBits_naive(0x55, 2) == 0x3333u (with \"detail::duplBits_naive(0x55, 2)\"="
                   ,&local_320);
    local_322 = 1;
    std::operator+(&local_2e0,&local_300,", \"0x3333u\"=");
    local_323 = 1;
    stringify<unsigned_int>(&local_348,_cmp__2);
    local_349 = 1;
    std::operator+(&local_2c0,&local_2e0,&local_348);
    local_34a = 1;
    std::operator+(&local_2a0,&local_2c0,")");
    local_34b = 1;
    local_280 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_2a0);
    tl__3 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_360 = "run";
    local_358 = 0x1b;
    loc_01.function = "run";
    loc_01.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_01.line = 0x1b;
    assertFail(local_280,loc_01);
  }
  local_321 = 0;
  local_322 = 0;
  local_323 = 0;
  local_349 = 0;
  local_34a = 0;
  local_34b = 0;
  tr__3 = (uint *)detail::duplBits_naive(0xff,2);
  local_370 = &tr__3;
  local_384 = 0xffff;
  _cmp__3 = &local_384;
  local_388 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_370,_cmp__3);
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_438,(unsigned_long *)local_370);
    local_439 = 1;
    std::operator+(&local_418,
                   "Comparison failed: detail::duplBits_naive(0xff, 2) == 0xffffu (with \"detail::duplBits_naive(0xff, 2)\"="
                   ,&local_438);
    local_43a = 1;
    std::operator+(&local_3f8,&local_418,", \"0xffffu\"=");
    local_43b = 1;
    stringify<unsigned_int>(&local_460,_cmp__3);
    local_461 = 1;
    std::operator+(&local_3d8,&local_3f8,&local_460);
    local_462 = 1;
    std::operator+(&local_3b8,&local_3d8,")");
    local_463 = 1;
    local_398 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b8);
    tl__4 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_478 = "run";
    local_470 = 0x1c;
    loc_02.function = "run";
    loc_02.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_02.line = 0x1c;
    assertFail(local_398,loc_02);
  }
  local_439 = 0;
  local_43a = 0;
  local_43b = 0;
  local_461 = 0;
  local_462 = 0;
  local_463 = 0;
  tr__4 = (uint *)detail::duplBits_naive(1,1);
  local_488 = &tr__4;
  local_49c = 1;
  _cmp__4 = &local_49c;
  local_4a0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_488,_cmp__4);
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_550,(unsigned_long *)local_488);
    local_551 = 1;
    std::operator+(&local_530,
                   "Comparison failed: detail::duplBits_naive(1, 1) == 1u (with \"detail::duplBits_naive(1, 1)\"="
                   ,&local_550);
    local_552 = 1;
    std::operator+(&local_510,&local_530,", \"1u\"=");
    local_553 = 1;
    stringify<unsigned_int>(&local_578,_cmp__4);
    local_579 = 1;
    std::operator+(&local_4f0,&local_510,&local_578);
    local_57a = 1;
    std::operator+(&local_4d0,&local_4f0,")");
    local_57b = 1;
    local_4b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4d0);
    tl__5 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_590 = "run";
    local_588 = 0x1d;
    loc_03.function = "run";
    loc_03.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_03.line = 0x1d;
    assertFail(local_4b0,loc_03);
  }
  local_551 = 0;
  local_552 = 0;
  local_553 = 0;
  local_579 = 0;
  local_57a = 0;
  local_57b = 0;
  tr__5 = (uint *)detail::duplBits_naive(1,2);
  local_5a0 = &tr__5;
  local_5b4 = 3;
  _cmp__5 = &local_5b4;
  local_5b8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_5a0,_cmp__5);
  local_669 = 0;
  local_66a = 0;
  local_66b = 0;
  local_691 = 0;
  local_692 = 0;
  local_693 = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_668,(unsigned_long *)local_5a0);
    local_669 = 1;
    std::operator+(&local_648,
                   "Comparison failed: detail::duplBits_naive(1, 2) == 3u (with \"detail::duplBits_naive(1, 2)\"="
                   ,&local_668);
    local_66a = 1;
    std::operator+(&local_628,&local_648,", \"3u\"=");
    local_66b = 1;
    stringify<unsigned_int>(&local_690,_cmp__5);
    local_691 = 1;
    std::operator+(&local_608,&local_628,&local_690);
    local_692 = 1;
    std::operator+(&local_5e8,&local_608,")");
    local_693 = 1;
    local_5c8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_5e8);
    tl__6 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_6a8 = "run";
    local_6a0 = 0x1e;
    loc_04.function = "run";
    loc_04.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_04.line = 0x1e;
    assertFail(local_5c8,loc_04);
  }
  local_669 = 0;
  local_66a = 0;
  local_66b = 0;
  local_691 = 0;
  local_692 = 0;
  local_693 = 0;
  tr__6 = (uint *)detail::duplBits_naive(1,4);
  local_6b8 = &tr__6;
  local_6cc = 0xf;
  _cmp__6 = &local_6cc;
  local_6d0 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_6b8,_cmp__6);
  local_781 = 0;
  local_782 = 0;
  local_783 = 0;
  local_7a9 = 0;
  local_7aa = 0;
  local_7ab = 0;
  if (!bVar1) {
    stringify<unsigned_long>(&local_780,(unsigned_long *)local_6b8);
    local_781 = 1;
    std::operator+(&local_760,
                   "Comparison failed: detail::duplBits_naive(1, 4) == 0xfu (with \"detail::duplBits_naive(1, 4)\"="
                   ,&local_780);
    local_782 = 1;
    std::operator+(&local_740,&local_760,", \"0xfu\"=");
    local_783 = 1;
    stringify<unsigned_int>(&local_7a8,_cmp__6);
    local_7a9 = 1;
    std::operator+(&local_720,&local_740,&local_7a8);
    local_7aa = 1;
    std::operator+(&local_700,&local_720,")");
    local_7ab = 1;
    local_6e0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_700);
    tl__7 = (uint64_t *)anon_var_dwarf_a493;
    pcStack_7c0 = "run";
    local_7b8 = 0x1f;
    loc_05.function = "run";
    loc_05.file = 
    "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
    ;
    loc_05.line = 0x1f;
    assertFail(local_6e0,loc_05);
  }
  local_781 = 0;
  local_782 = 0;
  local_783 = 0;
  local_7a9 = 0;
  local_7aa = 0;
  local_7ab = 0;
  tr__7 = (uint *)detail::duplBits_naive(1,8);
  local_7d0 = &tr__7;
  local_7e4 = 0xff;
  _cmp__7 = &local_7e4;
  local_7e8 = 0;
  bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                    ((unsigned_long *)local_7d0,_cmp__7);
  local_899 = 0;
  local_89a = 0;
  local_89b = 0;
  local_8c1 = 0;
  local_8c2 = 0;
  local_8c3 = 0;
  if (bVar1) {
    local_899 = 0;
    local_89a = 0;
    local_89b = 0;
    local_8c1 = 0;
    local_8c2 = 0;
    local_8c3 = 0;
    tr__8 = (uint *)detail::duplBits_naive(1,0x10);
    local_8e8 = &tr__8;
    local_8fc = 0xffff;
    _cmp__8 = &local_8fc;
    local_900 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                      ((unsigned_long *)local_8e8,_cmp__8);
    local_9b1 = 0;
    local_9b2 = 0;
    local_9b3 = 0;
    local_9d9 = 0;
    local_9da = 0;
    local_9db = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_9b0,(unsigned_long *)local_8e8);
      local_9b1 = 1;
      std::operator+(&local_990,
                     "Comparison failed: detail::duplBits_naive(1, 16) == 0xffffu (with \"detail::duplBits_naive(1, 16)\"="
                     ,&local_9b0);
      local_9b2 = 1;
      std::operator+(&local_970,&local_990,", \"0xffffu\"=");
      local_9b3 = 1;
      stringify<unsigned_int>(&local_9d8,_cmp__8);
      local_9d9 = 1;
      std::operator+(&local_950,&local_970,&local_9d8);
      local_9da = 1;
      std::operator+(&local_930,&local_950,")");
      local_9db = 1;
      local_910 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_930);
      tl__9 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_9f0 = "run";
      local_9e8 = 0x21;
      loc_07.function = "run";
      loc_07.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_07.line = 0x21;
      assertFail(local_910,loc_07);
    }
    local_9b1 = 0;
    local_9b2 = 0;
    local_9b3 = 0;
    local_9d9 = 0;
    local_9da = 0;
    local_9db = 0;
    tr__9 = (uint *)detail::duplBits_naive(1,0x20);
    local_a00 = &tr__9;
    local_a14 = 0xffffffff;
    _cmp__9 = &local_a14;
    local_a18 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_int>
                      ((unsigned_long *)local_a00,_cmp__9);
    local_ac9 = 0;
    local_aca = 0;
    local_acb = 0;
    local_af1 = 0;
    local_af2 = 0;
    local_af3 = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_ac8,(unsigned_long *)local_a00);
      local_ac9 = 1;
      std::operator+(&local_aa8,
                     "Comparison failed: detail::duplBits_naive(1, 32) == 0xffffffffu (with \"detail::duplBits_naive(1, 32)\"="
                     ,&local_ac8);
      local_aca = 1;
      std::operator+(&local_a88,&local_aa8,", \"0xffffffffu\"=");
      local_acb = 1;
      stringify<unsigned_int>(&local_af0,_cmp__9);
      local_af1 = 1;
      std::operator+(&local_a68,&local_a88,&local_af0);
      local_af2 = 1;
      std::operator+(&local_a48,&local_a68,")");
      local_af3 = 1;
      local_a28 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a48);
      tl__10 = (uint64_t *)anon_var_dwarf_a493;
      pcStack_b08 = "run";
      local_b00 = 0x22;
      loc_08.function = "run";
      loc_08.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_08.line = 0x22;
      assertFail(local_a28,loc_08);
    }
    local_ac9 = 0;
    local_aca = 0;
    local_acb = 0;
    local_af1 = 0;
    local_af2 = 0;
    local_af3 = 0;
    tr__10 = (unsigned_long *)detail::duplBits_naive(1,0x40);
    local_b18 = &tr__10;
    uStack_b30 = 0xffffffffffffffff;
    local_b28 = &stack0xfffffffffffff4d0;
    local_b34 = 0;
    bVar1 = detail::cmp<(bitmanip::detail::Cmp)0,unsigned_long,unsigned_long>
                      ((unsigned_long *)local_b18,local_b28);
    local_be9 = 0;
    local_bea = 0;
    local_beb = 0;
    if (!bVar1) {
      stringify<unsigned_long>(&local_be8,(unsigned_long *)local_b18);
      local_be9 = 1;
      std::operator+(&local_bc8,
                     "Comparison failed: detail::duplBits_naive(1, 64) == 0xffffffffffffffffu (with \"detail::duplBits_naive(1, 64)\"="
                     ,&local_be8);
      local_bea = 1;
      std::operator+(&local_ba8,&local_bc8,", \"0xffffffffffffffffu\"=");
      local_beb = 1;
      stringify<unsigned_long>(&local_c10,local_b28);
      std::operator+(&local_b88,&local_ba8,&local_c10);
      std::operator+(&local_b68,&local_b88,")");
      local_b48 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b68);
      loc_09.function = "run";
      loc_09.file = 
      "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp"
      ;
      loc_09.line = 0x23;
      assertFail(local_b48,loc_09);
    }
    return;
  }
  stringify<unsigned_long>(&local_898,(unsigned_long *)local_7d0);
  local_899 = 1;
  std::operator+(&local_878,
                 "Comparison failed: detail::duplBits_naive(1, 8) == 0xffu (with \"detail::duplBits_naive(1, 8)\"="
                 ,&local_898);
  local_89a = 1;
  std::operator+(&local_858,&local_878,", \"0xffu\"=");
  local_89b = 1;
  stringify<unsigned_int>(&local_8c0,_cmp__7);
  local_8c1 = 1;
  std::operator+(&local_838,&local_858,&local_8c0);
  local_8c2 = 1;
  std::operator+(&local_818,&local_838,")");
  local_8c3 = 1;
  local_7f8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_818);
  tl__8 = (uint64_t *)anon_var_dwarf_a493;
  pcStack_8d8 = "run";
  local_8d0 = 0x20;
  loc_06.function = "run";
  loc_06.file = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  loc_06.line = 0x20;
  assertFail(local_7f8,loc_06);
}

Assistant:

BITMANIP_TEST(bitileave, duplBits_naive_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 0), 0u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xf, 2), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0x55, 2), 0x3333u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(0xff, 2), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 1), 1u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 2), 3u);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 4), 0xfu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 8), 0xffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 16), 0xffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 32), 0xffffffffu);
    BITMANIP_STATIC_ASSERT_EQ(detail::duplBits_naive(1, 64), 0xffffffffffffffffu);
}